

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOStreamLogStream.h
# Opt level: O2

ssize_t __thiscall
Assimp::StdOStreamLogStream::write(StdOStreamLogStream *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  std::operator<<(this->mOstream,(char *)CONCAT44(in_register_00000034,__fd));
  sVar1 = std::ostream::flush();
  return sVar1;
}

Assistant:

inline void StdOStreamLogStream::write(const char* message) {
    mOstream << message;
    mOstream.flush();
}